

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O2

void __thiscall spdlog::logger::~logger(logger *this)

{
  ~logger(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

inline spdlog::logger::~logger() = default;